

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 10_dynamic_dofs_waypoints.cpp
# Opt level: O3

int main(void)

{
  void *pvVar1;
  Result RVar2;
  ostream *poVar3;
  allocator_type *__a;
  long lVar4;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  OutputParameter<0UL,_ruckig::StandardVector> output;
  InputParameter<0UL,_ruckig::StandardVector> input;
  Ruckig<0UL,_ruckig::StandardVector,_false> otg;
  long alStack_970 [2];
  allocator_type local_95c;
  allocator_type local_95b;
  allocator_type local_95a;
  allocator_type local_959;
  undefined1 local_958 [48];
  vector<double,_std::allocator<double>_> local_928;
  vector<double,_std::allocator<double>_> local_910;
  undefined1 local_8f8 [8];
  double local_8f0;
  double local_8e8 [4];
  double local_8c8 [4];
  double local_8a8 [4];
  double local_888 [4];
  undefined1 local_868 [224];
  double local_788;
  bool local_777;
  double local_770;
  undefined1 local_768 [48];
  vector<double,std::allocator<double>> local_738 [24];
  vector<double,std::allocator<double>> local_720 [24];
  vector<double,std::allocator<double>> local_708 [24];
  vector<double,std::allocator<double>> local_6f0 [24];
  vector<double,std::allocator<double>> local_6d8 [24];
  vector<double,std::allocator<double>> local_6c0 [24];
  vector<double,std::allocator<double>> local_6a8 [24];
  vector<double,std::allocator<double>> local_690 [88];
  vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
  local_638 [480];
  undefined1 local_458 [1064];
  
  alStack_970[0] = 0x109a4c;
  ruckig::Ruckig<0UL,_ruckig::StandardVector,_false>::Ruckig<0UL,_0>
            ((Ruckig<0UL,_ruckig::StandardVector,_false> *)local_458,3,0.01,10);
  alStack_970[0] = 0x109a5e;
  ruckig::InputParameter<0UL,_ruckig::StandardVector>::InputParameter<0UL,_0>
            ((InputParameter<0UL,_ruckig::StandardVector> *)local_768,3);
  alStack_970[0] = 0x109a75;
  ruckig::OutputParameter<0UL,_ruckig::StandardVector>::OutputParameter<0UL,_0>
            ((OutputParameter<0UL,_ruckig::StandardVector> *)local_868,3,10);
  local_958._0_4_ = 0x9999999a;
  local_958._4_4_ = 0x3fc99999;
  local_958._8_4_ = 0;
  local_958._12_4_ = 0;
  local_958._16_8_ = (pointer)0xbfd3333333333333;
  alStack_970[0] = 0x109aa5;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)(local_768 + 0x18),local_958);
  local_958._0_4_ = 0;
  local_958._4_4_ = 0;
  local_958._8_4_ = 0x9999999a;
  local_958._12_4_ = 0x3fc99999;
  local_958._16_8_ = (pointer)0x0;
  alStack_970[0] = 0x109acf;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>(local_738,local_958);
  local_958._0_4_ = 0;
  local_958._4_4_ = 0;
  local_958._8_4_ = 0x33333333;
  local_958._12_4_ = 0x3fe33333;
  local_958._16_8_ = (pointer)0x0;
  alStack_970[0] = 0x109afd;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            (local_720,local_958,(vector<double,_std::allocator<double>_> *)(local_958 + 0x18));
  local_888[0] = 1.4;
  local_888[1] = -1.6;
  local_888[2] = 1.0;
  alStack_970[0] = 0x109b34;
  __l._M_len = 3;
  __l._M_array = local_888;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_958,__l,&local_959);
  local_8a8[0] = -0.6;
  local_8a8[1] = -0.5;
  local_8a8[2] = 0.4;
  alStack_970[0] = 0x109b66;
  __l_00._M_len = 3;
  __l_00._M_array = local_8a8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)(local_958 + 0x18),__l_00,&local_95a);
  local_8c8[0] = -0.4;
  local_8c8[1] = -0.35;
  local_8c8[2] = 0.0;
  alStack_970[0] = 0x109b97;
  __l_01._M_len = 3;
  __l_01._M_array = local_8c8;
  std::vector<double,_std::allocator<double>_>::vector(&local_928,__l_01,&local_95b);
  local_8e8[0] = 0.8;
  local_8e8[1] = 1.8;
  local_8e8[2] = -0.1;
  __a = &local_95c;
  alStack_970[0] = 0x109bce;
  __l_02._M_len = 3;
  __l_02._M_array = local_8e8;
  std::vector<double,_std::allocator<double>_>::vector(&local_910,__l_02,__a);
  alStack_970[0] = 0x109be5;
  std::
  vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
  ::_M_assign_aux<std::vector<double,std::allocator<double>>const*>(local_638,local_958,local_8f8);
  lVar4 = 0x60;
  do {
    pvVar1 = *(void **)((long)alStack_970 + lVar4);
    if (pvVar1 != (void *)0x0) {
      alStack_970[0] = 0x109c02;
      operator_delete(pvVar1,*(long *)(&stack0xfffffffffffff6a0 + lVar4) - (long)pvVar1);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != 0);
  local_958._0_4_ = 0;
  local_958._4_4_ = 0x3fe00000;
  local_958._8_4_ = 0;
  local_958._12_4_ = 0x3ff00000;
  local_958._16_8_ = (pointer)0x0;
  alStack_970[0] = 0x109c32;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>(local_708,local_958);
  local_958._0_4_ = 0x9999999a;
  local_958._4_4_ = 0x3fc99999;
  local_958._8_4_ = 0;
  local_958._12_4_ = 0;
  local_958._16_8_ = (pointer)0x3fd3333333333333;
  alStack_970[0] = 0x109c62;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>(local_6f0,local_958);
  local_958._0_4_ = 0;
  local_958._4_4_ = 0;
  local_958._8_4_ = 0x9999999a;
  local_958._12_4_ = 0x3fb99999;
  local_958._16_8_ = (pointer)0xbfb999999999999a;
  alStack_970[0] = 0x109c88;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>(local_6d8,local_958);
  local_958._0_4_ = 0;
  local_958._4_4_ = 0x3ff00000;
  local_958._8_4_ = 0;
  local_958._12_4_ = 0x40000000;
  local_958._16_8_ = (pointer)0x3ff0000000000000;
  alStack_970[0] = 0x109cae;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>(local_6c0,local_958);
  local_958._0_4_ = 0;
  local_958._4_4_ = 0x40080000;
  local_958._8_4_ = 0;
  local_958._12_4_ = 0x40000000;
  local_958._16_8_ = (pointer)0x4000000000000000;
  alStack_970[0] = 0x109cde;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>(local_6a8,local_958);
  local_958._0_4_ = 0;
  local_958._4_4_ = 0x40180000;
  local_958._8_4_ = 0;
  local_958._12_4_ = 0x40240000;
  local_958._16_8_ = (pointer)0x4034000000000000;
  alStack_970[0] = 0x109d0e;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>(local_690,local_958);
  alStack_970[0] = 0x109d29;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"t | position",0xc);
  alStack_970[0] = 0x109d3d;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
  alStack_970[0] = 0x109d4c;
  std::ostream::put(-0x30);
  alStack_970[0] = 0x109d54;
  std::ostream::flush();
  local_8f0 = 0.0;
  while( true ) {
    alStack_970[0] = 0x109d8f;
    RVar2 = ruckig::Ruckig<0UL,_ruckig::StandardVector,_false>::update
                      ((Ruckig<0UL,_ruckig::StandardVector,_false> *)local_458,
                       (InputParameter<0UL,_ruckig::StandardVector> *)local_768,
                       (OutputParameter<0UL,_ruckig::StandardVector> *)local_868);
    if (RVar2 != Working) break;
    alStack_970[0] = 0x109dac;
    poVar3 = std::ostream::_M_insert<double>(local_788);
    alStack_970[0] = 0x109dbf;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," | ",3);
    alStack_970[0] = 0x109dd1;
    ruckig::join<std::vector<double,std::allocator<double>>>
              ((string *)local_958,(ruckig *)(local_868 + 0x80),
               (vector<double,_std::allocator<double>_> *)0x0,SUB81(__a,0));
    alStack_970[0] = 0x109de3;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(char *)CONCAT44(local_958._4_4_,local_958._0_4_),
                        CONCAT44(local_958._12_4_,local_958._8_4_));
    alStack_970[0] = 0x109dfa;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    alStack_970[0] = 0x109e05;
    std::ostream::put((char)poVar3);
    alStack_970[0] = 0x109e0d;
    std::ostream::flush();
    if ((undefined1 *)CONCAT44(local_958._4_4_,local_958._0_4_) != local_958 + 0x10) {
      alStack_970[0] = 0x109e29;
      operator_delete((undefined1 *)CONCAT44(local_958._4_4_,local_958._0_4_),local_958._16_8_ + 1);
    }
    alStack_970[0] = 0x109e34;
    ruckig::OutputParameter<0UL,_ruckig::StandardVector>::pass_to_input
              ((OutputParameter<0UL,_ruckig::StandardVector> *)local_868,
               (InputParameter<0UL,_ruckig::StandardVector> *)local_768);
    if (local_777 != false) {
      local_8f0 = local_770;
    }
  }
  alStack_970[0] = 0x109e6e;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Reached target position in ",0x1b);
  alStack_970[0] = 0x109e83;
  poVar3 = std::ostream::_M_insert<double>((double)local_868._32_8_);
  alStack_970[0] = 0x109e9a;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," [s].",5);
  alStack_970[0] = 0x109eae;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  alStack_970[0] = 0x109eb9;
  std::ostream::put((char)poVar3);
  alStack_970[0] = 0x109ec1;
  std::ostream::flush();
  alStack_970[0] = 0x109ed9;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Calculation in ",0xf);
  alStack_970[0] = 0x109eeb;
  poVar3 = std::ostream::_M_insert<double>(local_8f0);
  alStack_970[0] = 0x109f02;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,anon_var_dwarf_1f290,7);
  alStack_970[0] = 0x109f16;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  alStack_970[0] = 0x109f21;
  std::ostream::put((char)poVar3);
  alStack_970[0] = 0x109f29;
  std::ostream::flush();
  alStack_970[0] = 0x109f36;
  ruckig::OutputParameter<0UL,_ruckig::StandardVector>::~OutputParameter
            ((OutputParameter<0UL,_ruckig::StandardVector> *)local_868);
  alStack_970[0] = 0x109f43;
  ruckig::InputParameter<0UL,_ruckig::StandardVector>::~InputParameter
            ((InputParameter<0UL,_ruckig::StandardVector> *)local_768);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_458._1024_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    alStack_970[0] = 0x109f55;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_458._1024_8_);
  }
  alStack_970[0] = 0x109f62;
  ruckig::TargetCalculator<0UL,_ruckig::StandardVector>::~TargetCalculator
            ((TargetCalculator<0UL,_ruckig::StandardVector> *)(local_458 + 0x318));
  alStack_970[0] = 0x109f6f;
  ruckig::InputParameter<0UL,_ruckig::StandardVector>::~InputParameter
            ((InputParameter<0UL,_ruckig::StandardVector> *)local_458);
  return 0;
}

Assistant:

int main() {
    double control_cycle = 0.01;
    size_t DOFs = 3;
    size_t max_number_of_waypoints = 10;  // for memory allocation

    // Create instances: the Ruckig OTG as well as input and output parameters
    Ruckig<DynamicDOFs> otg(DOFs, control_cycle, max_number_of_waypoints);
    InputParameter<DynamicDOFs> input(DOFs);
    OutputParameter<DynamicDOFs> output(DOFs, max_number_of_waypoints);

    // Set input parameters
    input.current_position = {0.2, 0.0, -0.3};
    input.current_velocity = {0.0, 0.2, 0.0};
    input.current_acceleration = {0.0, 0.6, 0.0};

    input.intermediate_positions = {
        {1.4, -1.6, 1.0},
        {-0.6, -0.5, 0.4},
        {-0.4, -0.35, 0.0},
        {0.8, 1.8, -0.1}
    };

    input.target_position = {0.5, 1.0, 0.0};
    input.target_velocity = {0.2, 0.0, 0.3};
    input.target_acceleration = {0.0, 0.1, -0.1};

    input.max_velocity = {1.0, 2.0, 1.0};
    input.max_acceleration = {3.0, 2.0, 2.0};
    input.max_jerk = {6.0, 10.0, 20.0};

    std::cout << "t | position" << std::endl;
    double calculation_duration = 0.0;
    while (otg.update(input, output) == Result::Working) {
        std::cout << output.time << " | " << join(output.new_position) << std::endl;

        output.pass_to_input(input);

        if (output.new_calculation) {
            calculation_duration = output.calculation_duration;
        }
    }

    std::cout << "Reached target position in " << output.trajectory.get_duration() << " [s]." << std::endl;
    std::cout << "Calculation in " << calculation_duration << " [µs]." << std::endl;
}